

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgsession-decoder.c
# Opt level: O2

int mg_session_read_map(mg_session *session,mg_map **map)

{
  int iVar1;
  uint uVar2;
  mg_map *buf;
  ulong uVar3;
  ulong uVar4;
  uint32_t i;
  long lVar5;
  uint32_t size;
  mg_map **local_38;
  
  iVar1 = mg_session_read_container_size(session,&size,MG_MARKERS_MAP);
  if (iVar1 == 0) {
    buf = mg_map_alloc(size,session->decoder_allocator);
    if (buf == (mg_map *)0x0) {
      mg_session_set_error(session,"out of memory");
      iVar1 = -3;
    }
    else {
      buf->size = size;
      lVar5 = 0;
      local_38 = map;
      for (uVar4 = 0; size != uVar4; uVar4 = uVar4 + 1) {
        iVar1 = mg_session_read_string(session,(mg_string **)((long)buf->keys + lVar5));
        uVar2 = (uint)uVar4;
        if (iVar1 != 0) {
LAB_001067d0:
          for (uVar3 = 0; uVar2 != uVar3; uVar3 = uVar3 + 1) {
            mg_string_destroy_ca(buf->keys[uVar3],session->decoder_allocator);
          }
          for (uVar3 = 0; uVar4 != uVar3; uVar3 = uVar3 + 1) {
            mg_value_destroy_ca(buf->values[uVar3],session->decoder_allocator);
          }
          mg_allocator_free(session->decoder_allocator,buf);
          return iVar1;
        }
        iVar1 = mg_session_read_value(session,(mg_value **)((long)buf->values + lVar5));
        if (iVar1 != 0) {
          uVar2 = uVar2 + 1;
          goto LAB_001067d0;
        }
        lVar5 = lVar5 + 8;
      }
      *local_38 = buf;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int mg_session_read_map(mg_session *session, mg_map **map) {
  uint32_t size;
  MG_RETURN_IF_FAILED(
      mg_session_read_container_size(session, &size, MG_MARKERS_MAP));

  mg_map *tmap = mg_map_alloc(size, session->decoder_allocator);
  if (!tmap) {
    mg_session_set_error(session, "out of memory");
    return MG_ERROR_OOM;
  }

  int status = 0;

  tmap->size = size;

  uint32_t keys_read = 0;
  uint32_t values_read = 0;
  for (uint32_t i = 0; i < size; ++i) {
    status = mg_session_read_string(session, &tmap->keys[i]);
    if (status != 0) {
      goto cleanup;
    }
    keys_read++;
    status = mg_session_read_value(session, &tmap->values[i]);
    if (status != 0) {
      goto cleanup;
    }
    values_read++;
  }

  *map = tmap;
  return 0;

cleanup:
  for (uint32_t i = 0; i < keys_read; ++i) {
    mg_string_destroy_ca(tmap->keys[i], session->decoder_allocator);
  }
  for (uint32_t i = 0; i < values_read; ++i) {
    mg_value_destroy_ca(tmap->values[i], session->decoder_allocator);
  }
  mg_allocator_free(session->decoder_allocator, tmap);
  return status;
}